

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

VariableP<deqp::gls::BuiltinPrecisionTests::Void> __thiscall
deqp::gls::BuiltinPrecisionTests::variable<deqp::gls::BuiltinPrecisionTests::Void>
          (BuiltinPrecisionTests *this,string *name)

{
  Variable<deqp::gls::BuiltinPrecisionTests::Void> *this_00;
  SharedPtrStateBase *extraout_RDX;
  VariableP<deqp::gls::BuiltinPrecisionTests::Void> VVar1;
  
  this_00 = (Variable<deqp::gls::BuiltinPrecisionTests::Void> *)operator_new(0x28);
  Variable<deqp::gls::BuiltinPrecisionTests::Void>::Variable(this_00,name);
  de::
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
  ::SharedPtr((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
               *)this,this_00);
  VVar1.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
  .m_state = extraout_RDX;
  VVar1.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
  .m_ptr = (Variable<deqp::gls::BuiltinPrecisionTests::Void> *)this;
  return (VariableP<deqp::gls::BuiltinPrecisionTests::Void>)
         VVar1.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
  ;
}

Assistant:

VariableP<T> variable (const string& name)
{
	return VariableP<T>(new Variable<T>(name));
}